

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

int __thiscall
cmGlobalGenerator::Build
          (cmGlobalGenerator *this,int jobs,string *param_2,string *bindir,string *projectName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,ostream *ostr,string *makeCommandCSTR,string *config,cmBuildOptions *buildOptions
          ,bool verbose,cmDuration timeout,OutputOption outputflag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nativeOptions)

{
  cmake *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  GeneratedMakeCommand *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int retVal;
  OutputOption local_140;
  allocator_type local_13a;
  allocator<char> local_139;
  string makeCommandStr;
  string buildOutput;
  string outputMakeCommandStr;
  string outputBuffer;
  string realConfig;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  makeCommand;
  string local_78;
  cmWorkingDirectory workdir;
  
  bVar1 = cmSystemTools::s_RunCommandHideConsole;
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  poVar4 = std::operator<<(ostr,"Change Dir: \'");
  poVar4 = std::operator<<(poVar4,(string *)bindir);
  poVar4 = std::operator<<(poVar4,'\'');
  std::endl<char,std::char_traits<char>>(poVar4);
  if (workdir.ResultCode != 0) {
    cmSystemTools::s_RunCommandHideConsole = bVar1;
    outputBuffer._M_dataplus._M_p = strerror(workdir.ResultCode);
    cmStrCat<char_const(&)[29],char*>
              (&realConfig,(char (*) [29])"Failed to change directory: ",(char **)&outputBuffer);
    cmSystemTools::Error(&realConfig);
    poVar4 = std::operator<<(ostr,(string *)&realConfig);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&realConfig);
    iVar6 = 1;
    goto LAB_001fd3f7;
  }
  std::__cxx11::string::string((string *)&realConfig,(string *)config);
  if (realConfig._M_string_length == 0) {
    (*this->_vptr_cmGlobalGenerator[0x27])(&outputBuffer,this);
    std::__cxx11::string::operator=((string *)&realConfig,(string *)&outputBuffer);
    std::__cxx11::string::~string((string *)&outputBuffer);
  }
  retVal = 0;
  outputBuffer._M_dataplus._M_p = (pointer)&outputBuffer.field_2;
  outputBuffer._M_string_length = 0;
  cmSystemTools::s_RunCommandHideConsole = true;
  outputBuffer.field_2._M_local_buf[0] = '\0';
  (*this->_vptr_cmGlobalGenerator[0x15])
            (&makeCommand,this,makeCommandCSTR,projectName,bindir,targets,&realConfig,
             (ulong)(uint)jobs,(ulong)verbose,buildOptions,nativeOptions);
  local_140 = outputflag;
  if (outputflag == OUTPUT_PASSTHROUGH) {
    local_140 = makeCommand.
                super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].super_GeneratedMakeCommand.
                RequiresOutputForward ^ OUTPUT_PASSTHROUGH;
  }
  if (buildOptions->Clean == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&makeCommandStr,"clean",&local_139)
    ;
    __l._M_len = 1;
    __l._M_array = &makeCommandStr;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&buildOutput,__l,&local_13a);
    local_78.field_2._M_allocated_capacity = 0;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    (*this->_vptr_cmGlobalGenerator[0x15])
              (&outputMakeCommandStr,this,makeCommandCSTR,projectName,bindir,&buildOutput,
               &realConfig,(ulong)(uint)jobs,(ulong)verbose,buildOptions,&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&buildOutput);
    std::__cxx11::string::~string((string *)&makeCommandStr);
    poVar4 = std::operator<<(ostr,"\nRun Clean Command: ");
    detail::GeneratedMakeCommand::QuotedPrintable_abi_cxx11_
              (&makeCommandStr,(GeneratedMakeCommand *)outputMakeCommandStr._M_dataplus._M_p);
    poVar4 = std::operator<<(poVar4,(string *)&makeCommandStr);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&makeCommandStr);
    if (outputMakeCommandStr._M_string_length - (long)outputMakeCommandStr._M_dataplus._M_p == 0x20)
    {
      bVar2 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)outputMakeCommandStr._M_dataplus._M_p,&outputBuffer,&outputBuffer,
                         &retVal,(char *)0x0,local_140,timeout,Auto);
      if (bVar2) {
        std::operator<<(ostr,(string *)&outputBuffer);
        std::
        vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                   *)&outputMakeCommandStr);
        goto LAB_001fd096;
      }
      cmSystemTools::s_RunCommandHideConsole = bVar1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&makeCommandStr,"Generator: execution of make clean failed.",
                 (allocator<char> *)&buildOutput);
      cmSystemTools::Error(&makeCommandStr);
      std::__cxx11::string::~string((string *)&makeCommandStr);
      poVar4 = std::operator<<(ostr,(string *)&outputBuffer);
      poVar4 = std::operator<<(poVar4,"\nGenerator: execution of make clean failed.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      this_00 = this->CMakeInstance;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&makeCommandStr,
                 "The generator did not produce exactly one command for the \'clean\' target",
                 (allocator<char> *)&local_78);
      buildOutput._M_dataplus._M_p = (pointer)0x0;
      buildOutput._M_string_length = 0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&buildOutput);
      cmake::IssueMessage(this_00,INTERNAL_ERROR,&makeCommandStr,(cmListFileBacktrace *)&buildOutput
                         );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&buildOutput._M_string_length);
      std::__cxx11::string::~string((string *)&makeCommandStr);
    }
    std::
    vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
    ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               *)&outputMakeCommandStr);
    iVar6 = 1;
  }
  else {
LAB_001fd096:
    makeCommandStr._M_dataplus._M_p = (pointer)&makeCommandStr.field_2;
    makeCommandStr._M_string_length = 0;
    outputMakeCommandStr._M_dataplus._M_p = (pointer)&outputMakeCommandStr.field_2;
    outputMakeCommandStr._M_string_length = 0;
    makeCommandStr.field_2._M_local_buf[0] = '\0';
    outputMakeCommandStr.field_2._M_local_buf[0] = '\0';
    bVar2 = cmState::UseWatcomWMake
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    buildOutput._M_dataplus._M_p = (pointer)&buildOutput.field_2;
    buildOutput._M_string_length = 0;
    buildOutput.field_2._M_local_buf[0] = '\0';
    std::operator<<(ostr,"\nRun Build Command(s): ");
    retVal = 0;
    this_01 = &(makeCommand.
                super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                ._M_impl.super__Vector_impl_data._M_start)->super_GeneratedMakeCommand;
    while ((this_01 !=
            &(makeCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_finish)->super_GeneratedMakeCommand &&
           (retVal == 0))) {
      detail::GeneratedMakeCommand::Printable_abi_cxx11_(&local_78,this_01);
      std::__cxx11::string::operator=((string *)&makeCommandStr,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      detail::GeneratedMakeCommand::QuotedPrintable_abi_cxx11_(&local_78,this_01);
      std::__cxx11::string::operator=((string *)&outputMakeCommandStr,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      if (this_01 + 1 !=
          &(makeCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish)->super_GeneratedMakeCommand) {
        std::__cxx11::string::append((char *)&makeCommandStr);
        std::__cxx11::string::append((char *)&outputMakeCommandStr);
      }
      poVar4 = std::operator<<(ostr,(string *)&outputMakeCommandStr);
      std::endl<char,std::char_traits<char>>(poVar4);
      bVar3 = cmSystemTools::RunSingleCommand
                        (&this_01->PrimaryCommand,&outputBuffer,&outputBuffer,&retVal,(char *)0x0,
                         local_140,timeout,Auto);
      if (!bVar3) {
        cmSystemTools::s_RunCommandHideConsole = bVar1;
        cmStrCat<char_const(&)[56],std::__cxx11::string&>
                  (&local_78,(char (*) [56])0x6c299d,&makeCommandStr);
        cmSystemTools::Error(&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        poVar4 = std::operator<<(ostr,(string *)&outputBuffer);
        poVar4 = std::operator<<(poVar4,"\nGenerator: execution of make failed. Make command was: ")
        ;
        poVar4 = std::operator<<(poVar4,(string *)&outputMakeCommandStr);
        std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_001fd2e8;
      }
      std::operator<<(ostr,(string *)&outputBuffer);
      std::ostream::flush();
      if (bVar2) {
        std::__cxx11::string::append((string *)&buildOutput);
      }
      this_01 = this_01 + 1;
    }
    std::endl<char,std::char_traits<char>>(ostr);
    iVar6 = retVal;
    cmSystemTools::s_RunCommandHideConsole = bVar1;
    if ((bVar2 && retVal == 0) &&
       (lVar5 = std::__cxx11::string::find((char *)&buildOutput,0x6c29d5), iVar6 = retVal,
       lVar5 != -1)) {
      retVal = 1;
LAB_001fd2e8:
      iVar6 = 1;
    }
    std::__cxx11::string::~string((string *)&buildOutput);
    std::__cxx11::string::~string((string *)&outputMakeCommandStr);
    std::__cxx11::string::~string((string *)&makeCommandStr);
  }
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::~vector(&makeCommand);
  std::__cxx11::string::~string((string *)&outputBuffer);
  std::__cxx11::string::~string((string *)&realConfig);
LAB_001fd3f7:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar6;
}

Assistant:

int cmGlobalGenerator::Build(
  int jobs, const std::string& /*unused*/, const std::string& bindir,
  const std::string& projectName, const std::vector<std::string>& targets,
  std::ostream& ostr, const std::string& makeCommandCSTR,
  const std::string& config, const cmBuildOptions& buildOptions, bool verbose,
  cmDuration timeout, cmSystemTools::OutputOption outputflag,
  std::vector<std::string> const& nativeOptions)
{
  bool hideconsole = cmSystemTools::GetRunCommandHideConsole();

  /**
   * Run an executable command and put the stdout in output.
   */
  cmWorkingDirectory workdir(bindir);
  ostr << "Change Dir: '" << bindir << '\'' << std::endl;
  if (workdir.Failed()) {
    cmSystemTools::SetRunCommandHideConsole(hideconsole);
    std::string err = cmStrCat("Failed to change directory: ",
                               std::strerror(workdir.GetLastResult()));
    cmSystemTools::Error(err);
    ostr << err << std::endl;
    return 1;
  }
  std::string realConfig = config;
  if (realConfig.empty()) {
    realConfig = this->GetDefaultBuildConfig();
  }

  int retVal = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::string outputBuffer;
  std::string* outputPtr = &outputBuffer;

  std::vector<GeneratedMakeCommand> makeCommand = this->GenerateBuildCommand(
    makeCommandCSTR, projectName, bindir, targets, realConfig, jobs, verbose,
    buildOptions, nativeOptions);

  // Workaround to convince some commands to produce output.
  if (outputflag == cmSystemTools::OUTPUT_PASSTHROUGH &&
      makeCommand.back().RequiresOutputForward) {
    outputflag = cmSystemTools::OUTPUT_FORWARD;
  }

  // should we do a clean first?
  if (buildOptions.Clean) {
    std::vector<GeneratedMakeCommand> cleanCommand =
      this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir,
                                 { "clean" }, realConfig, jobs, verbose,
                                 buildOptions);
    ostr << "\nRun Clean Command: " << cleanCommand.front().QuotedPrintable()
         << std::endl;
    if (cleanCommand.size() != 1) {
      this->GetCMakeInstance()->IssueMessage(MessageType::INTERNAL_ERROR,
                                             "The generator did not produce "
                                             "exactly one command for the "
                                             "'clean' target");
      return 1;
    }
    if (!cmSystemTools::RunSingleCommand(cleanCommand.front().PrimaryCommand,
                                         outputPtr, outputPtr, &retVal,
                                         nullptr, outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error("Generator: execution of make clean failed.");
      ostr << *outputPtr << "\nGenerator: execution of make clean failed."
           << std::endl;

      return 1;
    }
    ostr << *outputPtr;
  }

  // now build
  std::string makeCommandStr;
  std::string outputMakeCommandStr;
  bool isWatcomWMake = this->CMakeInstance->GetState()->UseWatcomWMake();
  bool needBuildOutput = isWatcomWMake;
  std::string buildOutput;
  ostr << "\nRun Build Command(s): ";

  retVal = 0;
  for (auto command = makeCommand.begin();
       command != makeCommand.end() && retVal == 0; ++command) {
    makeCommandStr = command->Printable();
    outputMakeCommandStr = command->QuotedPrintable();
    if ((command + 1) != makeCommand.end()) {
      makeCommandStr += " && ";
      outputMakeCommandStr += " && ";
    }

    ostr << outputMakeCommandStr << std::endl;
    if (!cmSystemTools::RunSingleCommand(command->PrimaryCommand, outputPtr,
                                         outputPtr, &retVal, nullptr,
                                         outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error(
        cmStrCat("Generator: execution of make failed. Make command was: ",
                 makeCommandStr));
      ostr << *outputPtr
           << "\nGenerator: execution of make failed. Make command was: "
           << outputMakeCommandStr << std::endl;

      return 1;
    }
    ostr << *outputPtr << std::flush;
    if (needBuildOutput) {
      buildOutput += *outputPtr;
    }
  }
  ostr << std::endl;
  cmSystemTools::SetRunCommandHideConsole(hideconsole);

  // The OpenWatcom tools do not return an error code when a link
  // library is not found!
  if (isWatcomWMake && retVal == 0 &&
      buildOutput.find("W1008: cannot open") != std::string::npos) {
    retVal = 1;
  }

  return retVal;
}